

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readArrayBasedContainer<QList<Qt::DayOfWeek>>(QDataStream *s,QList<Qt::DayOfWeek> *c)

{
  long lVar1;
  Status SVar2;
  QList<Qt::DayOfWeek> *this;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  undefined4 in_stack_ffffffffffffff78;
  parameter_type in_stack_ffffffffffffff7c;
  QDataStream *in_stack_ffffffffffffff80;
  long local_68;
  undefined1 *asize;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  asize = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver
            ((StreamStateSaver *)in_stack_ffffffffffffff80,
             (QDataStream *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QList<Qt::DayOfWeek>::clear((QList<Qt::DayOfWeek> *)in_stack_ffffffffffffff80);
  this = (QList<Qt::DayOfWeek> *)QDataStream::readQSizeType(in_stack_ffffffffffffff80);
  if ((long)this < 0) {
    QDataStream::setStatus(in_RDI,SizeLimitExceeded);
  }
  else {
    QList<Qt::DayOfWeek>::reserve(this,(qsizetype)asize);
    for (local_68 = 0; local_68 < (long)this; local_68 = local_68 + 1) {
      ::operator>>(in_stack_ffffffffffffff80,
                   (DayOfWeek *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 != Ok) {
        QList<Qt::DayOfWeek>::clear((QList<Qt::DayOfWeek> *)in_stack_ffffffffffffff80);
        break;
      }
      QList<Qt::DayOfWeek>::append((QList<Qt::DayOfWeek> *)0x4ef3b3,in_stack_ffffffffffffff7c);
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}